

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  char cVar8;
  int iVar9;
  ImU32 IVar10;
  GetterYs<signed_char> *pGVar11;
  TransformerLogLog *pTVar12;
  ImPlotPlot *pIVar13;
  ImDrawVert *pIVar14;
  uint *puVar15;
  ImPlotContext *pIVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  ImVec2 IVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar16 = GImPlot;
  pGVar11 = this->Getter;
  pTVar12 = this->Transformer;
  iVar9 = pGVar11->Count;
  cVar8 = pGVar11->Ys
          [(long)(((prim + 1 + pGVar11->Offset) % iVar9 + iVar9) % iVar9) * (long)pGVar11->Stride];
  dVar18 = log10(((double)(prim + 1) * pGVar11->XScale + pGVar11->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar16->LogDenX;
  pIVar13 = pIVar16->CurrentPlot;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  dVar19 = log10((double)(int)cVar8 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  iVar9 = pTVar12->YAxis;
  pIVar13 = pIVar16->CurrentPlot;
  dVar6 = pIVar13->YAxis[iVar9].Range.Min;
  IVar20.x = (float)((((double)(float)(dVar18 / dVar3) * (dVar5 - dVar4) + dVar4) -
                     (pIVar13->XAxis).Range.Min) * pIVar16->Mx +
                    (double)pIVar16->PixelRange[iVar9].Min.x);
  fVar21 = (float)((((double)(float)(dVar19 / pIVar16->LogDenY[iVar9]) *
                     (pIVar13->YAxis[iVar9].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar16->My[iVar9] + (double)pIVar16->PixelRange[iVar9].Min.y);
  fVar2 = (this->P1).x;
  fVar22 = (this->P1).y;
  fVar23 = fVar22;
  if (fVar21 <= fVar22) {
    fVar23 = fVar21;
  }
  bVar17 = false;
  if ((fVar23 < (cull_rect->Max).y) &&
     (fVar22 = (float)(-(uint)(fVar21 <= fVar22) & (uint)fVar22 |
                      ~-(uint)(fVar21 <= fVar22) & (uint)fVar21), pfVar1 = &(cull_rect->Min).y,
     bVar17 = false, *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar2;
    if (IVar20.x <= fVar2) {
      fVar22 = IVar20.x;
    }
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(IVar20.x <= fVar2) & (uint)IVar20.x |
                      -(uint)(IVar20.x <= fVar2) & (uint)fVar2);
      bVar17 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar22 = (this->P1).y;
    fVar23 = fVar22 + this->HalfWeight;
    fVar22 = fVar22 - this->HalfWeight;
    IVar10 = this->Col;
    IVar7 = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = fVar2;
    (pIVar14->pos).y = fVar23;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar10;
    pIVar14[1].pos.x = IVar20.x;
    pIVar14[1].pos.y = fVar22;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar10;
    pIVar14[2].pos.x = fVar2;
    pIVar14[2].pos.y = fVar22;
    pIVar14[2].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar10;
    pIVar14[3].pos.x = IVar20.x;
    pIVar14[3].pos.y = fVar23;
    pIVar14[3].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar10;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    puVar15 = DrawList->_IdxWritePtr;
    *puVar15 = DrawList->_VtxCurrentIdx;
    puVar15[1] = DrawList->_VtxCurrentIdx + 1;
    puVar15[2] = DrawList->_VtxCurrentIdx + 2;
    puVar15[3] = DrawList->_VtxCurrentIdx;
    puVar15[4] = DrawList->_VtxCurrentIdx + 1;
    puVar15[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar15 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar23 = IVar20.x - this->HalfWeight;
    fVar22 = this->HalfWeight + IVar20.x;
    fVar2 = (this->P1).y;
    IVar10 = this->Col;
    IVar7 = *uv;
    pIVar14[4].pos.x = fVar23;
    pIVar14[4].pos.y = fVar21;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar10;
    pIVar14[1].pos.x = fVar22;
    pIVar14[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar10;
    pIVar14[2].pos.x = fVar23;
    pIVar14[2].pos.y = fVar2;
    pIVar14[2].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar10;
    pIVar14[3].pos.x = fVar22;
    pIVar14[3].pos.y = fVar21;
    pIVar14[3].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar10;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    puVar15 = DrawList->_IdxWritePtr;
    *puVar15 = DrawList->_VtxCurrentIdx;
    puVar15[1] = DrawList->_VtxCurrentIdx + 1;
    puVar15[2] = DrawList->_VtxCurrentIdx + 2;
    puVar15[3] = DrawList->_VtxCurrentIdx;
    puVar15[4] = DrawList->_VtxCurrentIdx + 1;
    puVar15[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar15 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar20.y = fVar21;
  this->P1 = IVar20;
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }